

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O1

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            bool partitioned,vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  uint uVar1;
  uint *puVar2;
  pointer piVar3;
  pointer pdVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  uint uVar6;
  bool bVar7;
  HighsStatus HVar8;
  int iVar9;
  pointer pcVar10;
  int iVar11;
  char *pcVar12;
  HighsStatus HVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  HighsInt component;
  u8 meta;
  HighsHashTable<int,_void> index_set;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  vector<double,_std::allocator<double>_> *pvVar23;
  undefined4 uVar24;
  uint local_fc;
  int local_f8;
  u8 local_f1;
  ulong local_f0;
  int local_e4;
  double local_e0;
  double local_d8;
  ulong local_d0;
  double local_c8;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  long local_a0;
  double local_98;
  double local_90;
  HighsInt local_84;
  long local_80;
  double local_78;
  HighsHashTable<int,_void> local_70;
  u64 local_48;
  u64 local_40;
  u64 local_38;
  
  pvVar23 = matrix_value;
  local_c8 = small_matrix_value;
  local_78 = large_matrix_value;
  HVar8 = assessMatrixDimensions
                    (log_options,num_vec,partitioned,matrix_start,matrix_p_end,matrix_index,
                     matrix_value);
  if (HVar8 != kError) {
    puVar2 = (uint *)(matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    uVar16 = *puVar2;
    if (uVar16 == 0) {
      local_a0 = (long)num_vec;
      iVar9 = 0;
      if (partitioned) {
        iVar9 = *(matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      local_b8 = CONCAT44(local_b8._4_4_,iVar9);
      local_c0 = CONCAT44(local_c0._4_4_,puVar2[local_a0]);
      bVar19 = 0 < num_vec;
      local_f0 = (ulong)(uint)num_vec;
      local_84 = vec_dim;
      if (num_vec < 1) {
        uVar16 = 0;
      }
      else {
        local_b0 = (ulong)(uint)num_vec;
        uVar14 = 0;
        uVar15 = 0;
        do {
          uVar16 = (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
          if ((int)uVar16 < (int)uVar15) {
            pcVar10 = (matrix_name->_M_dataplus)._M_p;
            pcVar12 = "%s matrix packed vector %d has illegal start of %d < %d = previous start\n";
            uVar1 = uVar16;
            uVar6 = uVar15;
LAB_0037f0a5:
            pvVar23 = (vector<double,_std::allocator<double>_> *)
                      CONCAT44((int)((ulong)pvVar23 >> 0x20),uVar6);
            bVar7 = false;
            highsLogUser(log_options,kError,pcVar12,pcVar10,uVar14 & 0xffffffff,(ulong)uVar1,pvVar23
                        );
            uVar6 = uVar15;
          }
          else {
            bVar7 = true;
            uVar6 = uVar16;
            if (partitioned) {
              uVar1 = (matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar14];
              local_b8 = CONCAT44(local_b8._4_4_,uVar1);
              if ((int)uVar1 < (int)uVar16) {
                pcVar10 = (matrix_name->_M_dataplus)._M_p;
                pcVar12 = 
                "%s matrix packed vector %d has illegal partition end of %d < %d =  start\n";
                goto LAB_0037f0a5;
              }
            }
          }
          uVar15 = uVar6;
          if (!bVar7) break;
          uVar14 = uVar14 + 1;
          bVar19 = uVar14 < local_b0;
        } while (uVar14 != local_b0);
      }
      if (!bVar19) {
        if ((int)local_c0 < (int)uVar16) {
          pcVar10 = (matrix_name->_M_dataplus)._M_p;
          pcVar12 = "%s matrix packed vector %d has illegal start of %d > %d = number of nonzeros\n"
          ;
        }
        else {
          if ((!partitioned) || ((int)(uint)local_b8 <= (int)local_c0)) {
            local_a8 = matrix_start;
            HighsHashTable<int,_void>::HighsHashTable(&local_70);
            uVar14 = 0;
            iVar9 = (int)local_f0;
            local_f0 = local_f0 & 0xffffffff;
            if (iVar9 < 1) {
              local_f0 = uVar14;
            }
            local_d8 = 0.0;
            local_d0 = 0;
            local_fc = 0;
            local_e4 = 0;
            local_90 = 0.0;
            local_e0 = INFINITY;
            local_98 = INFINITY;
            for (; uVar14 != local_f0; uVar14 = uVar14 + 1) {
              piVar3 = (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar16 = piVar3[uVar14];
              lVar17 = (long)(int)uVar16;
              iVar9 = piVar3[uVar14 + 1];
              piVar3[uVar14] = (int)local_d0;
              bVar19 = (int)uVar16 < iVar9;
              if ((int)uVar16 < iVar9) {
                local_c0 = (ulong)uVar16;
                local_b0 = lVar17 * 4;
                local_80 = lVar17 * 8;
                lVar18 = 0;
                local_b8 = (long)iVar9;
                do {
                  uVar24 = (undefined4)((ulong)pvVar23 >> 0x20);
                  local_f8 = *(int *)((long)(matrix_index->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_start + lVar18 * 4 + local_b0
                                     );
                  if (local_f8 < 0) {
                    pcVar12 = "%s matrix packed vector %d, entry %d, is illegal index %d\n";
LAB_0037f2ff:
                    bVar7 = false;
                    pvVar23 = (vector<double,_std::allocator<double>_> *)CONCAT44(uVar24,local_f8);
                    highsLogUser(log_options,kError,pcVar12,(matrix_name->_M_dataplus)._M_p,
                                 uVar14 & 0xffffffff,(ulong)(uint)((int)local_c0 + (int)lVar18),
                                 pvVar23);
                  }
                  else if (local_f8 < local_84) {
                    bVar7 = HighsHashTable<int,_void>::findPosition
                                      (&local_70,&local_f8,&local_f1,&local_40,&local_48,&local_38);
                    uVar24 = (undefined4)((ulong)pvVar23 >> 0x20);
                    if (bVar7 && local_70.entries._M_t.
                                 super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                 .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                 _M_head_impl !=
                                 (__uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                  )0x0) {
                      pcVar12 = "%s matrix packed vector %d, entry %d, is duplicate index %d\n";
                      goto LAB_0037f2ff;
                    }
                    dVar20 = ABS(*(double *)
                                  ((long)(matrix_value->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start +
                                  lVar18 * 8 + local_80));
                    if (local_78 <= dVar20) {
                      dVar21 = dVar20;
                      if (dVar20 <= local_90) {
                        dVar21 = local_90;
                      }
                      dVar22 = dVar20;
                      if (local_98 <= dVar20) {
                        dVar22 = local_98;
                      }
                      local_e4 = local_e4 + 1;
                      local_98 = dVar22;
                      local_90 = dVar21;
                    }
                    if (dVar20 <= local_c8) {
                      dVar21 = dVar20;
                      if (dVar20 <= local_d8) {
                        dVar21 = local_d8;
                      }
                      dVar22 = dVar20;
                      if (local_e0 <= dVar20) {
                        dVar22 = local_e0;
                      }
                      local_fc = local_fc + 1;
                      local_e0 = dVar22;
                      local_d8 = dVar21;
                    }
                    bVar7 = true;
                    if (local_c8 < dVar20) {
                      HighsHashTable<int,void>::insert<int&>
                                ((HighsHashTable<int,void> *)&local_70,&local_f8);
                      piVar3 = (matrix_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                               .super__Vector_impl_data._M_start;
                      iVar11 = (int)local_d0;
                      piVar3[iVar11] = *(int *)((long)piVar3 + lVar18 * 4 + local_b0);
                      pdVar4 = (matrix_value->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      pdVar4[iVar11] = *(double *)((long)pdVar4 + lVar18 * 8 + local_80);
                      local_d0 = (ulong)(iVar11 + 1);
                    }
                  }
                  else {
                    bVar7 = false;
                    pvVar23 = (vector<double,_std::allocator<double>_> *)CONCAT44(uVar24,local_f8);
                    highsLogUser(log_options,kError,
                                 "%s matrix packed vector %d, entry %d, is illegal index %12d >= %d = vector dimension\n"
                                 ,(matrix_name->_M_dataplus)._M_p,uVar14 & 0xffffffff,
                                 (ulong)(uint)((int)local_c0 + (int)lVar18),pvVar23,local_84);
                  }
                  if (!bVar7) break;
                  bVar19 = lVar18 + lVar17 + 1 < local_b8;
                  lVar18 = lVar18 + 1;
                } while ((uVar16 - iVar9) + (int)lVar18 != 0);
              }
              if (bVar19) break;
              HighsHashTable<int,_void>::clear(&local_70);
            }
            HVar8 = kError;
            if (local_a0 <= (long)uVar14) {
              bVar19 = local_e4 != 0;
              if (bVar19) {
                highsLogUser(log_options,kError,
                             "%s matrix packed vector contains %d |values| in [%g, %g] greater than %g\n"
                             ,local_98,local_90,local_78,(matrix_name->_M_dataplus)._M_p);
              }
              pvVar5 = local_a8;
              HVar13 = kOk;
              if (local_fc != 0) {
                if (partitioned) {
                  highsLogUser(log_options,kError,
                               "%s matrix packed partitioned vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                               ,local_e0,local_d8,local_c8,(matrix_name->_M_dataplus)._M_p,
                               (ulong)local_fc);
                }
                bVar19 = partitioned || bVar19;
                HVar13 = kOk;
                if (0.0 < local_d8) {
                  HVar13 = kWarning;
                  highsLogUser(log_options,kWarning,
                               "%s matrix packed vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                               ,local_e0,local_d8,local_c8,(matrix_name->_M_dataplus)._M_p,
                               (ulong)local_fc);
                }
              }
              (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[local_a0] = (int)local_d0;
              HVar8 = kError;
              if (!bVar19) {
                HVar8 = HVar13;
              }
            }
            HighsHashTable<int,_void>::~HighsHashTable(&local_70);
            return HVar8;
          }
          pcVar10 = (matrix_name->_M_dataplus)._M_p;
          pcVar12 = 
          "%s matrix packed vector %d has illegal partition end of %d > %d = number of nonzeros\n";
          uVar16 = (uint)local_b8;
        }
        highsLogUser(log_options,kError,pcVar12,pcVar10,local_f0,(ulong)uVar16,
                     CONCAT44((int)((ulong)pvVar23 >> 0x20),(int)local_c0));
      }
    }
    else {
      highsLogUser(log_options,kError,"%s matrix start vector begins with %d rather than 0\n",
                   (matrix_name->_M_dataplus)._M_p,(ulong)uVar16);
    }
  }
  return kError;
}

Assistant:

HighsStatus assessMatrix(
    const HighsLogOptions& log_options, const std::string matrix_name,
    const HighsInt vec_dim, const HighsInt num_vec, const bool partitioned,
    vector<HighsInt>& matrix_start, vector<HighsInt>& matrix_p_end,
    vector<HighsInt>& matrix_index, vector<double>& matrix_value,
    const double small_matrix_value, const double large_matrix_value) {
  if (assessMatrixDimensions(log_options, num_vec, partitioned, matrix_start,
                             matrix_p_end, matrix_index,
                             matrix_value) == HighsStatus::kError) {
    return HighsStatus::kError;
  }

  bool error_found = false;
  bool warning_found = false;

  const HighsInt num_nz = matrix_start[num_vec];
  // Assess the starts
  //
  // Check whether the first start is zero
  if (matrix_start[0]) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix start vector begins with %" HIGHSINT_FORMAT
                 " rather than 0\n",
                 matrix_name.c_str(), matrix_start[0]);
    return HighsStatus::kError;
  }
  // Set up previous_start for a fictitious previous empty packed vector
  HighsInt previous_start = matrix_start[0];
  // Set up this_start to be the first start in case num_vec = 0
  HighsInt this_start = matrix_start[0];
  HighsInt this_p_end = 0;
  if (partitioned) this_p_end = matrix_p_end[0];
  for (HighsInt ix = 0; ix < num_vec; ix++) {
    this_start = matrix_start[ix];
    bool this_start_too_small = this_start < previous_start;
    if (this_start_too_small) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal start of %" HIGHSINT_FORMAT
                   " < %" HIGHSINT_FORMAT
                   " = "
                   "previous start\n",
                   matrix_name.c_str(), ix, this_start, previous_start);
      return HighsStatus::kError;
    }
    if (partitioned) {
      this_p_end = matrix_p_end[ix];
      bool this_p_end_too_small = this_p_end < this_start;
      if (this_p_end_too_small) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     " has illegal partition end of %" HIGHSINT_FORMAT
                     " < %" HIGHSINT_FORMAT
                     " = "
                     " start\n",
                     matrix_name.c_str(), ix, this_p_end, this_start);
        return HighsStatus::kError;
      }
    }
    previous_start = this_start;
  }
  bool this_start_too_big = this_start > num_nz;
  if (this_start_too_big) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector %" HIGHSINT_FORMAT
                 " has illegal start of %" HIGHSINT_FORMAT
                 " > %" HIGHSINT_FORMAT
                 " = "
                 "number of nonzeros\n",
                 matrix_name.c_str(), num_vec, this_start, num_nz);
    return HighsStatus::kError;
  }
  if (partitioned) {
    bool this_p_end_too_big = this_p_end > num_nz;
    if (this_p_end_too_big) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal partition end of %" HIGHSINT_FORMAT
                   " > %" HIGHSINT_FORMAT
                   " = "
                   "number of nonzeros\n",
                   matrix_name.c_str(), num_vec, this_p_end, num_nz);
      return HighsStatus::kError;
    }
  }
  // Assess the indices and values
  // Count the number of acceptable indices/values
  HighsInt num_new_nz = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  HighsInt num_large_values = 0;
  double max_large_value = 0;
  double min_large_value = kHighsInf;
  // Use index_map to identify duplicates.
  HighsHashTable<HighsInt> index_set;

  for (HighsInt ix = 0; ix < num_vec; ix++) {
    HighsInt from_el = matrix_start[ix];
    HighsInt to_el = matrix_start[ix + 1];
    // Account for any index-value pairs removed so far
    matrix_start[ix] = num_new_nz;
    for (HighsInt el = from_el; el < to_el; el++) {
      // Check the index
      HighsInt component = matrix_index[el];
      // Check that the index is non-negative
      bool legal_component = component >= 0;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check that the index does not exceed the vector dimension
      legal_component = component < vec_dim;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index "
                     "%12" HIGHSINT_FORMAT " >= %" HIGHSINT_FORMAT
                     " = vector dimension\n",
                     matrix_name.c_str(), ix, el, component, vec_dim);
        return HighsStatus::kError;
      }
      // Check that the index has not already occurred.
      legal_component = index_set.find(component) == nullptr;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is duplicate index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check the value
      double abs_value = fabs(matrix_value[el]);
      // Check that the value is not too large
      bool large_value = abs_value >= large_matrix_value;
      if (large_value) {
        if (max_large_value < abs_value) max_large_value = abs_value;
        if (min_large_value > abs_value) min_large_value = abs_value;
        num_large_values++;
      }
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      if (ok_value) {
        // Record where the index has occurred
        index_set.insert(component);
        // Shift the index and value of the OK entry to the new
        // position in the index and value vectors, and increment
        // the new number of nonzeros
        matrix_index[num_new_nz] = matrix_index[el];
        matrix_value[num_new_nz] = matrix_value[el];
        num_new_nz++;
      }
    }  // Loop from_el; to_el
    index_set.clear();
  }  // Loop 0; num_vec
  if (num_large_values) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] greater than %g\n",
                 matrix_name.c_str(), num_large_values, min_large_value,
                 max_large_value, large_matrix_value);
    error_found = true;
  }
  if (num_small_values) {
    if (partitioned) {
      // Shouldn't happen with a partitioned row-wise matrix since its
      // values should be OK and the code above doesn't handle p_end
      highsLogUser(
          log_options, HighsLogType::kError,
          "%s matrix packed partitioned vector contains %" HIGHSINT_FORMAT
          " |values| in [%g, %g] less than or equal to %g: ignored\n",
          matrix_name.c_str(), num_small_values, min_small_value,
          max_small_value, small_matrix_value);
      error_found = true;
      assert(num_small_values == 0);
    }
    // If explicit zeros are ignored, then no model information is
    // lost, so only report and return a warning if small nonzeros are
    // ignored
    if (max_small_value > 0) {
      highsLogUser(log_options, HighsLogType::kWarning,
                   "%s matrix packed vector contains %" HIGHSINT_FORMAT
                   " |values| in [%g, %g] "
                   "less than or equal to %g: ignored\n",
                   matrix_name.c_str(), num_small_values, min_small_value,
                   max_small_value, small_matrix_value);
      warning_found = true;
    }
  }
  matrix_start[num_vec] = num_new_nz;
  HighsStatus return_status = HighsStatus::kOk;
  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  return return_status;
}